

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

VMapEntry *
FindEntry<Assimp::LWO::VColorChannel>
          (vector<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_> *list,
          string *name,bool perPoly)

{
  bool bVar1;
  __type _Var2;
  Logger *this;
  VMapEntry *pVVar3;
  VMapEntry *p;
  VColorChannel local_b8;
  VMapEntry *local_48;
  VColorChannel *elem;
  iterator __end0;
  iterator __begin0;
  vector<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_> *__range1;
  bool perPoly_local;
  string *name_local;
  vector<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_> *list_local;
  
  __end0 = std::vector<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>::
           begin(list);
  elem = (VColorChannel *)
         std::vector<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>::end
                   (list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<Assimp::LWO::VColorChannel_*,_std::vector<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>_>
                                *)&elem);
    if (!bVar1) {
      Assimp::LWO::VColorChannel::VColorChannel(&local_b8);
      std::vector<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>::
      push_back(list,&local_b8);
      Assimp::LWO::VColorChannel::~VColorChannel(&local_b8);
      pVVar3 = &std::vector<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
                ::back(list)->super_VMapEntry;
      std::__cxx11::string::operator=((string *)&pVVar3->name,(string *)name);
      return pVVar3;
    }
    local_48 = &__gnu_cxx::
                __normal_iterator<Assimp::LWO::VColorChannel_*,_std::vector<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>_>
                ::operator*(&__end0)->super_VMapEntry;
    _Var2 = std::operator==(&local_48->name,name);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<Assimp::LWO::VColorChannel_*,_std::vector<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>_>
    ::operator++(&__end0);
  }
  if (!perPoly) {
    this = Assimp::DefaultLogger::get();
    Assimp::Logger::warn(this,"LWO2: Found two VMAP sections with equal names");
  }
  return local_48;
}

Assistant:

VMapEntry* FindEntry(std::vector< T >& list,const std::string& name, bool perPoly)
{
    for (auto & elem : list)   {
        if (elem.name == name) {
            if (!perPoly)   {
                ASSIMP_LOG_WARN("LWO2: Found two VMAP sections with equal names");
            }
            return &elem;
        }
    }
    list.push_back( T() );
    VMapEntry* p = &list.back();
    p->name = name;
    return p;
}